

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

void __thiscall cmFileCopier::cmFileCopier(cmFileCopier *this,cmFileCommand *command,char *name)

{
  cmMakefile *pcVar1;
  char *name_local;
  cmFileCommand *command_local;
  cmFileCopier *this_local;
  
  this->_vptr_cmFileCopier = (_func_int **)&PTR__cmFileCopier_00ac89e8;
  this->FileCommand = command;
  pcVar1 = cmCommand::GetMakefile(&command->super_cmCommand);
  this->Makefile = pcVar1;
  this->Name = name;
  this->Always = false;
  cmFileTimeCache::cmFileTimeCache(&this->FileTimes);
  this->MatchlessFiles = true;
  this->FilePermissions = 0;
  this->DirPermissions = 0;
  std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::vector
            (&this->MatchRules);
  this->CurrentMatchRule = (MatchRule *)0x0;
  this->UseGivenPermissionsFile = false;
  this->UseGivenPermissionsDir = false;
  this->UseSourcePermissions = true;
  this->FollowSymlinkChain = false;
  std::__cxx11::string::string((string *)&this->Destination);
  std::__cxx11::string::string((string *)&this->FilesFromDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Files);
  this->Doing = 0;
  return;
}

Assistant:

cmFileCopier::cmFileCopier(cmFileCommand* command, const char* name)
  : FileCommand(command)
  , Makefile(command->GetMakefile())
  , Name(name)
  , Always(false)
  , MatchlessFiles(true)
  , FilePermissions(0)
  , DirPermissions(0)
  , CurrentMatchRule(nullptr)
  , UseGivenPermissionsFile(false)
  , UseGivenPermissionsDir(false)
  , UseSourcePermissions(true)
  , FollowSymlinkChain(false)
  , Doing(DoingNone)
{
}